

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

nng_err nni_http_server_set_error_page(nni_http_server *s,nng_http_status code,char *html)

{
  char *body_00;
  nng_err rv;
  char *body;
  char *html_local;
  nng_http_status code_local;
  nni_http_server *s_local;
  
  body_00 = nni_strdup(html);
  if (body_00 == (char *)0x0) {
    s_local._4_4_ = NNG_ENOMEM;
  }
  else {
    s_local._4_4_ = http_server_set_err(s,code,body_00);
    if (s_local._4_4_ != NNG_OK) {
      nni_strfree(body_00);
    }
  }
  return s_local._4_4_;
}

Assistant:

nng_err
nni_http_server_set_error_page(
    nni_http_server *s, nng_http_status code, const char *html)
{
	char   *body;
	nng_err rv;

	// We copy the content, without the trailing NUL.
	if ((body = nni_strdup(html)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((rv = http_server_set_err(s, code, body)) != 0) {
		nni_strfree(body);
	}
	return (rv);
}